

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket_service.hpp
# Opt level: O0

int __thiscall
asio::stream_socket_service<asio::ip::tcp>::close
          (stream_socket_service<asio::ip::tcp> *this,int __fd)

{
  int iVar1;
  
  iVar1 = detail::reactive_socket_service_base::close
                    (&(this->service_impl_).super_reactive_socket_service_base,__fd);
  return iVar1;
}

Assistant:

asio::error_code close(implementation_type& impl,
      asio::error_code& ec)
  {
    return service_impl_.close(impl, ec);
  }